

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

uint64_t __thiscall google::protobuf::internal::SerialArena::SpaceUsed(SerialArena *this)

{
  __pointer_type pSVar1;
  ArenaBlock *this_00;
  ulong uVar2;
  __pointer_type pcVar3;
  char *pcVar4;
  uint64_t uVar5;
  ulong uVar6;
  
  pSVar1 = (this->string_block_)._M_b._M_p;
  if (pSVar1 == (__pointer_type)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = ((ulong)pSVar1->allocated_size_ -
            (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i) - 0x10;
  }
  this_00 = (this->head_)._M_b._M_p;
  uVar2 = this_00->size;
  if (uVar2 != 0) {
    pcVar3 = (this->ptr_)._M_b._M_p;
    pcVar4 = ArenaBlock::Pointer(this_00,0x10);
    uVar6 = (long)pcVar3 - (long)pcVar4;
    if (uVar2 < uVar6) {
      uVar6 = uVar2;
    }
    uVar5 = (this->space_used_).super___atomic_base<unsigned_long>._M_i + uVar5 + uVar6;
  }
  return uVar5;
}

Assistant:

uint64_t SerialArena::SpaceUsed() const {
  // Note: the calculation below technically causes a race with
  // AllocateNewBlock when called from another thread (which happens in
  // ThreadSafeArena::SpaceUsed).  However, worst-case space_used_ will have
  // stale data and the calculation will incorrectly assume 100%
  // usage of the *current* block.
  // TODO Consider eliminating this race in exchange for a possible
  // performance hit on ARM (see cl/455186837).

  uint64_t space_used = 0;
  StringBlock* sb = string_block_.load(std::memory_order_acquire);
  if (sb) {
    size_t unused = string_block_unused_.load(std::memory_order_relaxed);
    space_used += sb->effective_size() - unused;
  }
  const ArenaBlock* h = head_.load(std::memory_order_acquire);
  if (h->IsSentry()) return space_used;

  const uint64_t current_block_size = h->size;
  space_used += std::min(
      static_cast<uint64_t>(
          ptr() - const_cast<ArenaBlock*>(h)->Pointer(kBlockHeaderSize)),
      current_block_size);
  return space_used + space_used_.load(std::memory_order_relaxed);
}